

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

uint * __thiscall
google::protobuf::RepeatedField<unsigned_int>::elements(RepeatedField<unsigned_int> *this)

{
  LogMessage *other;
  LogMessage local_58;
  LogFinisher local_19;
  
  if (this->total_size_ < 1) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x161);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (total_size_) > (0): ");
    internal::LogFinisher::operator=(&local_19,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return (uint *)this->arena_or_elements_;
}

Assistant:

Element* elements() const {
    GOOGLE_DCHECK_GT(total_size_, 0);
    // Because of above pre-condition this cast is safe.
    return unsafe_elements();
  }